

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O0

string_t duckdb::BinaryStrOperator::Operation<duckdb::string_t,duckdb::string_t>
                   (string_t input,Vector *result)

{
  byte bVar1;
  char *pcVar2;
  idx_t iVar3;
  string_t *this;
  idx_t i_1;
  uint8_t byte;
  idx_t i;
  char *output;
  idx_t size;
  char *data;
  string_t target;
  idx_t in_stack_ffffffffffffffa8;
  long lVar4;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  ulong local_48;
  string_t local_20;
  anon_union_16_2_67f50693_for_value local_10;
  
  pcVar2 = string_t::GetData((string_t *)
                             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  iVar3 = string_t::GetSize(&local_20);
  local_10.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString
                 ((Vector *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffa8);
  this = (string_t *)
         string_t::GetDataWriteable
                   ((string_t *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  for (local_48 = 0; local_48 < iVar3; local_48 = local_48 + 1) {
    bVar1 = pcVar2[local_48];
    for (lVar4 = 8; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(byte *)&this->value = ((byte)((int)(uint)bVar1 >> ((char)lVar4 - 1U & 0x1f)) & 1) + 0x30;
      this = (string_t *)((long)&this->value + 1);
    }
  }
  string_t::Finalize(this);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		// Allocate empty space
		auto target = StringVector::EmptyString(result, size * 8);
		auto output = target.GetDataWriteable();

		for (idx_t i = 0; i < size; ++i) {
			auto byte = static_cast<uint8_t>(data[i]);
			for (idx_t i = 8; i >= 1; --i) {
				*output = ((byte >> (i - 1)) & 0x01) + '0';
				output++;
			}
		}

		target.Finalize();
		return target;
	}